

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketHelper.cpp
# Opt level: O1

int hwnet::SetNoBlock(int fd,bool nonBlock)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = fcntl(fd,3,0);
  if (uVar2 != 0xffffffff) {
    uVar1 = uVar2 ^ 0x800;
    if (nonBlock) {
      uVar1 = uVar2 | 0x800;
    }
    iVar3 = fcntl(fd,4,(ulong)uVar1);
    return iVar3;
  }
  return -1;
}

Assistant:

int SetNoBlock(int fd,bool nonBlock) {
	int flags;
    if((flags = fcntl(fd, F_GETFL, 0)) == -1) {
    	return -1;
    }

    if(nonBlock){
    	flags |= O_NONBLOCK;
    } else {
    	flags ^= O_NONBLOCK;
    }

    return fcntl(fd, F_SETFL, flags);
}